

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void duckdb::RangeTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::TableFunction,_true> *pvVar2;
  vector<duckdb::TableFunction,_true> *this;
  long lVar3;
  named_parameter_type_map_t *__ht;
  table_function_bind_t *__src;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  __alloc_node_gen_t __alloc_node_gen_7;
  TableFunctionSet range;
  TableFunctionSet generate_series;
  TableFunction generate_series_in_out;
  TableFunction range_in_out;
  allocator_type local_14b9;
  pointer local_14b8;
  _func_int **local_14b0;
  pointer local_14a8;
  element_type *peStack_14a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1498;
  BuiltinFunctions *local_1490;
  LogicalType local_1488 [3];
  TableFunctionSet local_1440;
  TableFunctionSet local_1408;
  string local_13d0;
  TableFunction local_13b0;
  TableFunctionSet local_11f8;
  TableFunctionSet local_11c0;
  string local_1188;
  undefined1 local_1168 [48];
  LogicalType local_1138 [4];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_10d8;
  undefined1 auStack_10a0 [48];
  code *local_1070;
  element_type *local_fc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fc0;
  TableFunctionInitialization local_fb8;
  undefined1 local_fa8 [48];
  LogicalType local_f78 [4];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_f18;
  undefined1 auStack_ee0 [48];
  code *local_eb0;
  element_type *local_e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e00;
  TableFunctionInitialization local_df8;
  undefined1 local_df0 [144];
  __buckets_ptr local_d60;
  size_type local_d58;
  __node_base local_d50;
  size_type local_d48;
  _Prime_rehash_policy local_d40;
  __node_base_ptr local_d30;
  undefined1 auStack_d28 [216];
  element_type *local_c50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c48;
  TableFunctionInitialization local_c40;
  undefined1 local_c38 [144];
  __buckets_ptr local_ba8;
  size_type local_ba0;
  __node_base local_b98;
  size_type local_b90;
  _Prime_rehash_policy local_b88;
  __node_base_ptr local_b78;
  undefined1 auStack_b70 [216];
  element_type *local_a98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a90;
  TableFunctionInitialization local_a88;
  undefined1 local_a80 [152];
  size_type local_9e8;
  __node_base local_9e0;
  size_type local_9d8;
  _Prime_rehash_policy local_9d0;
  __node_base_ptr local_9c0;
  undefined1 auStack_9b8 [216];
  element_type *local_8e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d8;
  TableFunctionInitialization local_8d0;
  undefined1 local_8c8 [144];
  __buckets_ptr local_838;
  size_type local_830;
  __node_base local_828;
  size_type local_820;
  _Prime_rehash_policy local_818;
  __node_base_ptr local_808;
  undefined1 local_800 [216];
  element_type *local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_720;
  TableFunctionInitialization local_718;
  undefined1 local_710 [144];
  __buckets_ptr local_680;
  size_type local_678;
  __node_base local_670;
  size_type local_668;
  _Prime_rehash_policy local_660;
  __node_base_ptr local_650;
  undefined1 local_648 [216];
  element_type *local_570;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_568;
  TableFunctionInitialization local_560;
  undefined1 local_558 [144];
  __buckets_ptr local_4c8;
  size_type local_4c0;
  __node_base local_4b8;
  size_type local_4b0;
  _Prime_rehash_policy local_4a8;
  __node_base_ptr local_498;
  undefined1 local_490 [216];
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  TableFunctionInitialization local_3a8;
  undefined1 local_3a0 [152];
  size_type local_308;
  __node_base local_300;
  size_type local_2f8;
  _Prime_rehash_policy local_2f0;
  __node_base_ptr local_2e0;
  undefined1 local_2d8 [216];
  element_type *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  TableFunctionInitialization local_1f0;
  undefined1 local_1e8 [152];
  size_type local_150;
  __node_base local_148;
  size_type local_140;
  _Prime_rehash_policy local_138;
  __node_base_ptr local_128;
  undefined1 local_120 [216];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  TableFunctionInitialization local_38;
  
  local_1490 = set;
  local_1188._M_dataplus._M_p = (pointer)&local_1188.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1188,"range","");
  TableFunctionSet::TableFunctionSet(&local_1440,&local_1188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1188._M_dataplus._M_p != &local_1188.field_2) {
    operator_delete(local_1188._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)local_1168,BIGINT);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1168;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_fa8,__l,
             (allocator_type *)local_1488);
  TableFunction::TableFunction
            (&local_13b0,(vector<duckdb::LogicalType,_true> *)local_fa8,(table_function_t)0x0,
             RangeFunctionBind<false>,(table_function_init_global_t)0x0,RangeFunctionLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_fa8);
  LogicalType::~LogicalType((LogicalType *)local_1168);
  local_13b0.in_out_function = RangeFunction<false>;
  local_13b0.cardinality = RangeCardinality;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_a80,(SimpleFunction *)&local_13b0);
  local_14b0 = (_func_int **)&PTR__SimpleNamedParameterFunction_0243ff38;
  local_a80._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_fa8._0_8_ = local_a80 + 0x90;
  __ht = &local_13b0.super_SimpleNamedParameterFunction.named_parameters;
  local_a80._144_8_ = (__buckets_ptr)0x0;
  local_9e8 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_9e0._M_nxt = (_Hash_node_base *)0x0;
  local_9d8 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_9d0._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_9d0._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_9d0._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_9c0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_fa8._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_fa8);
  local_14b8 = (pointer)&PTR__TableFunction_02435168;
  local_a80._0_8_ = &PTR__TableFunction_02435168;
  __src = &local_13b0.bind;
  switchD_012b9b0d::default(auStack_9b8,__src,0xd6);
  local_8e0 = local_13b0.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8d8._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_8d0 = local_13b0.global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_a80);
  local_a80._0_8_ = local_14b8;
  if (local_8d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_a80);
  LogicalType::LogicalType((LogicalType *)local_fa8,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_fa8 + 0x18),BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_fa8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488,__l_00,
             (allocator_type *)&local_1408);
  local_1168._16_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1168._8_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1168._0_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1488[0]._0_8_;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1488[0]._0_8_ = (pointer)0x0;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1168);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_fa8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1e8,(SimpleFunction *)&local_13b0);
  local_fa8._0_8_ = local_1e8 + 0x90;
  local_1e8._0_8_ = local_14b0;
  local_1e8._144_8_ = (__buckets_ptr)0x0;
  local_150 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_148._M_nxt = (_Hash_node_base *)0x0;
  local_140 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_138._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_138._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_138._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_128 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_fa8._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_fa8);
  local_1e8._0_8_ = local_14b8;
  switchD_012b9b0d::default(local_120,__src,0xd6);
  local_48 = local_13b0.function_info.internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_38 = local_13b0.global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_1e8);
  local_1e8._0_8_ = local_14b8;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1e8);
  LogicalType::LogicalType((LogicalType *)local_fa8,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_fa8 + 0x18),BIGINT);
  LogicalType::LogicalType(local_f78,BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_fa8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488,__l_01,
             (allocator_type *)&local_1408);
  local_1168._16_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1168._8_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1168._0_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1488[0]._0_8_;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1488[0]._0_8_ = (pointer)0x0;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1168);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_fa8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3a0,(SimpleFunction *)&local_13b0);
  local_fa8._0_8_ = local_3a0 + 0x90;
  local_3a0._0_8_ = local_14b0;
  local_3a0._144_8_ = (__buckets_ptr)0x0;
  local_308 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_300._M_nxt = (_Hash_node_base *)0x0;
  local_2f8 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_2f0._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_2f0._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_2f0._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_2e0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_fa8._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_fa8);
  local_3a0._0_8_ = local_14b8;
  switchD_012b9b0d::default(local_2d8,__src,0xd6);
  local_200 = local_13b0.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1f8._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_1f0 = local_13b0.global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_3a0);
  local_3a0._0_8_ = local_14b8;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_3a0);
  LogicalType::LogicalType((LogicalType *)local_1168,TIMESTAMP);
  LogicalType::LogicalType((LogicalType *)(local_1168 + 0x18),TIMESTAMP);
  LogicalType::LogicalType(local_1138,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_1168;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488,__l_02,
             (allocator_type *)&local_1408);
  TableFunction::TableFunction
            ((TableFunction *)local_fa8,(vector<duckdb::LogicalType,_true> *)local_1488,
             (table_function_t)0x0,RangeDateTimeBind<false>,(table_function_init_global_t)0x0,
             RangeDateTimeLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1168 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_eb0 = RangeDateTimeFunction<false>;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_c38,(SimpleFunction *)local_fa8);
  local_c38._0_8_ = local_14b0;
  local_1168._0_8_ = &local_ba8;
  local_ba8 = (__buckets_ptr)0x0;
  local_ba0 = _Stack_f18._M_bucket_count;
  local_b98._M_nxt = (_Hash_node_base *)0x0;
  local_b90 = _Stack_f18._M_element_count;
  local_b88._M_max_load_factor = _Stack_f18._M_rehash_policy._M_max_load_factor;
  local_b88._4_4_ = _Stack_f18._M_rehash_policy._4_4_;
  local_b88._M_next_resize = _Stack_f18._M_rehash_policy._M_next_resize;
  local_b78 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1168._0_8_,&_Stack_f18,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1168);
  local_c38._0_8_ = local_14b8;
  switchD_012b9b0d::default(auStack_b70,auStack_ee0,0xd6);
  local_a98 = local_e08;
  local_a90._M_pi = local_e00._M_pi;
  if (local_e00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e00._M_pi)->_M_use_count = (local_e00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e00._M_pi)->_M_use_count = (local_e00._M_pi)->_M_use_count + 1;
    }
  }
  local_a88 = local_df8;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_c38);
  local_c38._0_8_ = local_14b8;
  if (local_a90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a90._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_c38);
  paVar1 = &local_11c0.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_11c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11c0,
             local_1440.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p,
             local_1440.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p +
             local_1440.super_FunctionSet<duckdb::TableFunction>.name._M_string_length);
  pvVar2 = &local_11c0.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  BuiltinFunctions::AddFunction(local_1490,&local_11c0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_11c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_13d0._M_dataplus._M_p = (pointer)&local_13d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d0,"generate_series","");
  TableFunctionSet::TableFunctionSet(&local_1408,&local_13d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13d0._M_dataplus._M_p != &local_13d0.field_2) {
    operator_delete(local_13d0._M_dataplus._M_p);
  }
  local_13b0.bind = RangeFunctionBind<true>;
  local_13b0.in_out_function = RangeFunction<true>;
  LogicalType::LogicalType((LogicalType *)&local_14a8,BIGINT);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_14a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488,__l_03,
             &local_14b9);
  local_1168._16_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1168._8_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1168._0_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1488[0]._0_8_;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_1488[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1488[0].id_ = INVALID;
  local_1488[0].physical_type_ = ~INVALID;
  local_1488[0]._2_6_ = 0;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1168);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  LogicalType::~LogicalType((LogicalType *)&local_14a8);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_558,(SimpleFunction *)&local_13b0);
  local_1168._0_8_ = &local_4c8;
  local_558._0_8_ = local_14b0;
  local_4c8 = (__buckets_ptr)0x0;
  local_4c0 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_4b8._M_nxt = (_Hash_node_base *)0x0;
  local_4b0 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_4a8._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_4a8._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_4a8._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_498 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1168._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1168);
  local_558._0_8_ = local_14b8;
  switchD_012b9b0d::default(local_490,__src,0xd6);
  local_3b8 = local_13b0.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3b0._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_3a8 = local_13b0.global_initialization;
  pvVar2 = &local_1408.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_558);
  local_558._0_8_ = local_14b8;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_558);
  LogicalType::LogicalType((LogicalType *)local_1168,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_1168 + 0x18),BIGINT);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1168;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8,__l_04
             ,&local_14b9);
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1488[0]._0_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1498._M_pi;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = local_14a8;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)peStack_14a0;
  local_14a8 = (pointer)0x0;
  peStack_14a0 = (element_type *)0x0;
  local_1498._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1168 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_710,(SimpleFunction *)&local_13b0);
  local_1168._0_8_ = &local_680;
  local_710._0_8_ = local_14b0;
  local_680 = (__buckets_ptr)0x0;
  local_678 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_670._M_nxt = (_Hash_node_base *)0x0;
  local_668 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_660._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_660._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_660._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_650 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1168._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1168);
  local_710._0_8_ = local_14b8;
  switchD_012b9b0d::default(local_648,__src,0xd6);
  local_570 = local_13b0.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_568._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_560 = local_13b0.global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_710);
  local_710._0_8_ = local_14b8;
  if (local_568._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_568._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_710);
  LogicalType::LogicalType((LogicalType *)local_1168,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_1168 + 0x18),BIGINT);
  LogicalType::LogicalType(local_1138,BIGINT);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_1168;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8,__l_05
             ,&local_14b9);
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1488[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1488[0]._0_8_ =
       local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1498._M_pi;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = local_14a8;
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)peStack_14a0;
  local_14a8 = (pointer)0x0;
  peStack_14a0 = (element_type *)0x0;
  local_1498._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1488);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1168 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_8c8,(SimpleFunction *)&local_13b0);
  local_1168._0_8_ = &local_838;
  local_8c8._0_8_ = local_14b0;
  local_838 = (__buckets_ptr)0x0;
  local_830 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_828._M_nxt = (_Hash_node_base *)0x0;
  local_820 = local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_818._M_max_load_factor =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_818._4_4_ =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_818._M_next_resize =
       local_13b0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_808 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1168._0_8_,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1168);
  local_8c8._0_8_ = local_14b8;
  switchD_012b9b0d::default(local_800,__src,0xd6);
  local_728 = local_13b0.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_720._M_pi =
       local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_13b0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_13b0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_718 = local_13b0.global_initialization;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_8c8);
  local_8c8._0_8_ = local_14b8;
  if (local_720._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_720._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_8c8);
  LogicalType::LogicalType(local_1488,TIMESTAMP);
  LogicalType::LogicalType(local_1488 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_1488 + 2,INTERVAL);
  __l_06._M_len = 3;
  __l_06._M_array = local_1488;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8,__l_06
             ,&local_14b9);
  TableFunction::TableFunction
            ((TableFunction *)local_1168,(vector<duckdb::LogicalType,_true> *)&local_14a8,
             (table_function_t)0x0,RangeDateTimeBind<true>,(table_function_init_global_t)0x0,
             RangeDateTimeLocalInit);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_14a8);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_1488[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_1070 = RangeDateTimeFunction<true>;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_df0,(SimpleFunction *)local_1168);
  local_df0._0_8_ = local_14b0;
  local_1488[0]._0_8_ = local_df0 + 0x90;
  local_d60 = (__buckets_ptr)0x0;
  local_d58 = _Stack_10d8._M_bucket_count;
  local_d50._M_nxt = (_Hash_node_base *)0x0;
  local_d48 = _Stack_10d8._M_element_count;
  local_d40._M_max_load_factor = _Stack_10d8._M_rehash_policy._M_max_load_factor;
  local_d40._4_4_ = _Stack_10d8._M_rehash_policy._4_4_;
  local_d40._M_next_resize = _Stack_10d8._M_rehash_policy._M_next_resize;
  local_d30 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1488[0]._0_8_,&_Stack_10d8,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1488);
  local_df0._0_8_ = local_14b8;
  switchD_012b9b0d::default(auStack_d28,auStack_10a0,0xd6);
  local_c50 = local_fc8;
  local_c48._M_pi = local_fc0._M_pi;
  if (local_fc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_fc0._M_pi)->_M_use_count = (local_fc0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_fc0._M_pi)->_M_use_count = (local_fc0._M_pi)->_M_use_count + 1;
    }
  }
  local_c40 = local_fb8;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (TableFunction *)local_df0);
  local_df0._0_8_ = local_14b8;
  if (local_c48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c48._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_df0);
  paVar1 = &local_11f8.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_11f8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11f8,
             local_1408.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p,
             local_1408.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p +
             local_1408.super_FunctionSet<duckdb::TableFunction>.name._M_string_length);
  this = &local_11f8.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  BuiltinFunctions::AddFunction(local_1490,&local_11f8);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_11f8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_1168._0_8_ = local_14b8;
  if (local_fc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fc0._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1168);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&pvVar2->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1408.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1408.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_fa8._0_8_ = local_14b8;
  if (local_e00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e00._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_fa8);
  local_13b0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)local_14b8;
  if (local_13b0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_13b0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_13b0.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1440.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1440.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1440.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1440.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RangeTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet range("range");

	TableFunction range_function({LogicalType::BIGINT}, nullptr, RangeFunctionBind<false>, nullptr,
	                             RangeFunctionLocalInit);
	range_function.in_out_function = RangeFunction<false>;
	range_function.cardinality = RangeCardinality;

	// single argument range: (end) - implicit start = 0 and increment = 1
	range.AddFunction(range_function);
	// two arguments range: (start, end) - implicit increment = 1
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT};
	range.AddFunction(range_function);
	// three arguments range: (start, end, increment)
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT};
	range.AddFunction(range_function);
	TableFunction range_in_out({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL}, nullptr,
	                           RangeDateTimeBind<false>, nullptr, RangeDateTimeLocalInit);
	range_in_out.in_out_function = RangeDateTimeFunction<false>;
	range.AddFunction(range_in_out);
	set.AddFunction(range);
	// generate_series: similar to range, but inclusive instead of exclusive bounds on the RHS
	TableFunctionSet generate_series("generate_series");
	range_function.bind = RangeFunctionBind<true>;
	range_function.in_out_function = RangeFunction<true>;
	range_function.arguments = {LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	range_function.arguments = {LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT};
	generate_series.AddFunction(range_function);
	TableFunction generate_series_in_out({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                     nullptr, RangeDateTimeBind<true>, nullptr, RangeDateTimeLocalInit);
	generate_series_in_out.in_out_function = RangeDateTimeFunction<true>;
	generate_series.AddFunction(generate_series_in_out);
	set.AddFunction(generate_series);
}